

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::L1Error(Image *this,ImageChannelDesc *desc,Image *ref,Image *errorImage)

{
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  uint uVar2;
  ColorEncodingHandle *encoding;
  Point2i PVar3;
  ulong uVar4;
  size_t sVar5;
  Tuple2<pbrt::Point2,_int> p;
  Image *this_00;
  reference pvVar6;
  Point2i PVar7;
  reference pvVar8;
  Image *in_RCX;
  Image *in_RSI;
  ImageChannelValues *in_RDI;
  long in_R8;
  float fVar9;
  double dVar10;
  int c_1;
  Float error_1;
  int c;
  ImageChannelValues vref;
  ImageChannelValues v;
  int x;
  int y;
  Point2i vb;
  Point2i va;
  ImageChannelDesc refDesc;
  vector<double,_std::allocator<double>_> sumError;
  ImageChannelValues *error;
  Image *in_stack_fffffffffffffbf8;
  Image *in_stack_fffffffffffffc00;
  allocator_type *in_stack_fffffffffffffc08;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  ImageChannelValues *in_stack_fffffffffffffc20;
  Image *in_stack_fffffffffffffc38;
  value_type vVar11;
  char (*in_stack_fffffffffffffc40) [14];
  char (*in_stack_fffffffffffffc48) [17];
  ImageChannelDesc *in_stack_fffffffffffffc50;
  Image *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  LogLevel level;
  char *in_stack_fffffffffffffc68;
  Float in_stack_fffffffffffffc70;
  LogLevel in_stack_fffffffffffffc74;
  value_type_conflict1 c_00;
  char (*in_stack_fffffffffffffc80) [13];
  Point2<int> *in_stack_fffffffffffffc88;
  char (*in_stack_fffffffffffffc90) [17];
  Point2<int> *in_stack_fffffffffffffc98;
  Image *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  PixelFormat format;
  Image *in_stack_fffffffffffffd20;
  Allocator in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  size_t in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  int iVar12;
  ImageChannelDesc *in_stack_fffffffffffffd50;
  Image *in_stack_fffffffffffffd58;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffffd60;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd68;
  int local_238;
  int local_230;
  int iStack_228;
  int local_224;
  Image *local_220;
  Tuple2<pbrt::Point2,_int> local_c8;
  Tuple2<pbrt::Point2,_int> local_c0 [14];
  undefined1 local_49;
  undefined8 local_48;
  vector<double,_std::allocator<double>_> local_40;
  long local_28;
  Image *local_20;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  encoding = (ColorEncodingHandle *)ImageChannelDesc::size((ImageChannelDesc *)0x8757af);
  local_48 = 0;
  format = (PixelFormat)((ulong)&local_49 >> 0x20);
  std::allocator<double>::allocator((allocator<double> *)0x8757d8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc20,
             CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             (value_type_conflict6 *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::allocator<double>::~allocator((allocator<double> *)0x87580c);
  ChannelNames_abi_cxx11_(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  pstd::span<std::__cxx11::string_const>::
  span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffc10,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffc08);
  requestedChannels.n._0_7_ = in_stack_fffffffffffffce8;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       in_stack_fffffffffffffce0;
  requestedChannels.n._7_1_ = in_stack_fffffffffffffcef;
  GetChannelDesc(in_stack_fffffffffffffcd8,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffc10);
  bVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x875891);
  if (!bVar1) {
    LogFatal<char_const(&)[14]>
              (level,(char *)in_stack_fffffffffffffc58,
               (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),*in_stack_fffffffffffffc48,
               in_stack_fffffffffffffc40);
  }
  local_c0[0] = (Tuple2<pbrt::Point2,_int>)Resolution(in_RSI);
  local_c8 = (Tuple2<pbrt::Point2,_int>)Resolution(local_20);
  bVar1 = Tuple2<pbrt::Point2,_int>::operator==(local_c0,(Point2<int> *)&local_c8);
  if (!bVar1) {
    LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
              (in_stack_fffffffffffffc74,in_stack_fffffffffffffc68,level,
               (char *)in_stack_fffffffffffffc58,(char (*) [13])in_stack_fffffffffffffc50,
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc80,in_stack_fffffffffffffc88,
               in_stack_fffffffffffffc90,in_stack_fffffffffffffc98);
  }
  if (local_28 != 0) {
    Resolution(in_RSI);
    ChannelNames_abi_cxx11_(in_stack_fffffffffffffc38);
    pstd::span<std::__cxx11::string_const>::
    span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffc10,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc08);
    ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffc00);
    PVar3.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffd44;
    PVar3.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffd40;
    channels.ptr._4_4_ = in_stack_fffffffffffffd34;
    channels.ptr._0_4_ = in_stack_fffffffffffffd30;
    channels.n = in_stack_fffffffffffffd38;
    Image(in_stack_fffffffffffffd20,format,PVar3,channels,encoding,in_stack_fffffffffffffd28);
    operator=(in_stack_fffffffffffffc00,local_220);
    ~Image(in_stack_fffffffffffffc00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffbf8 = local_220;
  }
  local_224 = 0;
  while( true ) {
    PVar3 = Resolution(in_RSI);
    iStack_228 = PVar3.super_Tuple2<pbrt::Point2,_int>.y;
    if (iStack_228 <= local_224) break;
    local_230 = 0;
    while( true ) {
      PVar3 = Resolution(in_RSI);
      local_238 = PVar3.super_Tuple2<pbrt::Point2,_int>.x;
      if (local_238 <= local_230) break;
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc00,
                          (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                          (int)in_stack_fffffffffffffbf8);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffc10,
                 (WrapMode)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      GetChannels(in_stack_fffffffffffffd58,(Point2i)in_stack_fffffffffffffd68,
                  in_stack_fffffffffffffd50,(WrapMode2D)in_stack_fffffffffffffd60.values);
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc00,
                          (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                          (int)in_stack_fffffffffffffbf8);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffc10,
                 (WrapMode)((ulong)in_stack_fffffffffffffc08 >> 0x20));
      GetChannels(in_stack_fffffffffffffd58,(Point2i)in_stack_fffffffffffffd68,
                  in_stack_fffffffffffffd50,(WrapMode2D)in_stack_fffffffffffffd60.values);
      iVar12 = 0;
      while( true ) {
        uVar4 = (ulong)iVar12;
        sVar5 = ImageChannelDesc::size((ImageChannelDesc *)0x875d0b);
        if (sVar5 <= uVar4) break;
        p = (Tuple2<pbrt::Point2,_int>)
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                       in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8);
        c_00 = *(value_type_conflict1 *)p;
        this_00 = (Image *)InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                           operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                       *)in_stack_fffffffffffffc00,
                                      (size_type)in_stack_fffffffffffffbf8);
        fVar9 = c_00 - (float)this_00->format;
        uVar2 = std::isinf((double)(ulong)(uint)fVar9);
        in_stack_fffffffffffffc70 = (Float)CONCAT13((char)uVar2,SUB43(in_stack_fffffffffffffc70,0));
        if ((uVar2 & 1) == 0) {
          dVar10 = (double)fVar9;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar12);
          *pvVar6 = dVar10 + *pvVar6;
          if (local_28 != 0) {
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffc00,
                                (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
                                (int)in_stack_fffffffffffffbf8);
            SetChannel(this_00,(Point2i)p,(int)c_00,in_stack_fffffffffffffc70);
          }
        }
        iVar12 = iVar12 + 1;
      }
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x875eb5);
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x875ec2);
      local_230 = local_230 + 1;
    }
    local_224 = local_224 + 1;
  }
  ImageChannelDesc::size((ImageChannelDesc *)0x875f17);
  ImageChannelValues::ImageChannelValues
            (in_stack_fffffffffffffc20,CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18)
             ,(Float)((ulong)in_stack_fffffffffffffc10 >> 0x20));
  iVar12 = 0;
  while( true ) {
    uVar4 = (ulong)iVar12;
    sVar5 = ImageChannelDesc::size((ImageChannelDesc *)0x875f5b);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar12);
    vVar11 = *pvVar6;
    PVar3 = Resolution(in_RSI);
    PVar7 = Resolution(in_RSI);
    fVar9 = (float)(vVar11 / (double)(PVar3.super_Tuple2<pbrt::Point2,_int>.x *
                                     PVar7.super_Tuple2<pbrt::Point2,_int>.y));
    pvVar8 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8);
    *pvVar8 = fVar9;
    iVar12 = iVar12 + 1;
  }
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x876097);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc10);
  return in_RDI;
}

Assistant:

ImageChannelValues Image::L1Error(const ImageChannelDesc &desc, const Image &ref,
                                  Image *errorImage) const {
    std::vector<double> sumError(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (errorImage)
        *errorImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float error = v[c] - vref[c];
                if (std::isinf(error))
                    continue;
                sumError[c] += error;
                if (errorImage)
                    errorImage->SetChannel({x, y}, c, error);
            }
        }

    ImageChannelValues error(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        error[c] = sumError[c] / (Resolution().x * Resolution().y);
    return error;
}